

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

void __thiscall
cursespp::AppLayout::SetLayout(AppLayout *this,shared_ptr<cursespp::LayoutBase> *layout)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar2;
  mapped_type *pmVar3;
  ITopLevelLayout *pIVar4;
  ILayout *pIVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  uint uVar8;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  key_type local_30;
  
  peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      peVar1) {
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3c])();
      local_30 = &peVar1->super_ILayout;
      pmVar3 = std::
               map<cursespp::ILayout_*,_int,_std::less<cursespp::ILayout_*>,_std::allocator<std::pair<cursespp::ILayout_*const,_int>_>_>
               ::operator[](&lastFocusMap,&local_30);
      *pmVar3 = iVar2;
      local_40 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      local_38 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = local_38->_M_use_count + 1;
        }
      }
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x47])
                (this,&local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x2c])();
    }
    this_01 = (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    pIVar4 = this->topLevelLayout;
    if (pIVar4 != (ITopLevelLayout *)0x0) {
      (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0);
    }
    (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = &(this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(layout->
                        super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount);
    ShortcutsWindow::RemoveAll
              ((this->shortcuts).
               super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_50 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    if (local_50 != (element_type *)0x0) {
      peVar1 = (layout->super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (peVar1 == (element_type *)0x0) {
        this->topLevelLayout = (ITopLevelLayout *)0x0;
      }
      else {
        pIVar4 = (ITopLevelLayout *)
                 __dynamic_cast(peVar1,&LayoutBase::typeinfo,&ITopLevelLayout::typeinfo,
                                0xfffffffffffffffe);
        this->topLevelLayout = pIVar4;
        if (pIVar4 != (ITopLevelLayout *)0x0) {
          (**(code **)(*(long *)pIVar4 + 0x10))
                    (pIVar4,(this->shortcuts).
                            super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
          local_50 = (this->layout).
                     super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      }
      local_48 = this_00->_M_pi;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_use_count = local_48->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_use_count = local_48->_M_use_count + 1;
        }
      }
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x46])
                (this,&local_50);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x20])(peVar1,0);
      (*(this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable[0x44])
                (this);
      iVar2 = (*(((this->shortcuts).
                  super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x24])();
      if ((char)iVar2 == '\0') {
        peVar1 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pIVar5 = &peVar1->super_ILayout;
        if (peVar1 == (element_type *)0x0) {
          pIVar5 = (ILayout *)0x0;
        }
        uVar8 = 0;
        if (lastFocusMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var6 = &lastFocusMap._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var7 = lastFocusMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(undefined1 **)(p_Var7 + 1) >= pIVar5) {
              p_Var6 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[*(undefined1 **)(p_Var7 + 1) < pIVar5];
          } while (p_Var7 != (_Base_ptr)0x0);
          uVar8 = 0;
          if (((_Rb_tree_header *)p_Var6 != &lastFocusMap._M_t._M_impl.super__Rb_tree_header) &&
             (*(undefined1 **)(p_Var6 + 1) <= pIVar5)) {
            uVar8 = 0;
            if (0 < (int)*(uint *)&p_Var6[1]._M_parent) {
              uVar8 = *(uint *)&p_Var6[1]._M_parent;
            }
          }
        }
        (*(peVar1->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3d])
                  (peVar1,(ulong)uVar8,1);
      }
    }
  }
  return;
}

Assistant:

void AppLayout::SetLayout(std::shared_ptr<cursespp::LayoutBase> layout) {
    if (layout != this->layout) {
        if (this->layout) {
            last(this->layout.get(), this->layout->GetFocusIndex());
            this->RemoveWindow(this->layout);
            this->layout->Hide();
        }

        this->lastFocus.reset();

        if (this->topLevelLayout) {
            this->topLevelLayout->SetShortcutsWindow(nullptr);
        }

        this->layout = layout;
        this->shortcuts->RemoveAll();

        if (this->layout) {
            this->topLevelLayout = dynamic_cast<ITopLevelLayout*>(layout.get());
            if (this->topLevelLayout) {
                this->topLevelLayout->SetShortcutsWindow(this->shortcuts.get());
            }

            this->AddWindow(this->layout);
            this->layout->SetFocusOrder(0);
            this->Layout();

            if (!this->shortcuts->IsFocused()) {
                auto lastFocusIndex = std::max(0, last(this->layout.get()));
                this->layout->SetFocusIndex(lastFocusIndex);
            }
        }
    }
}